

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_debug.h
# Opt level: O2

bool immutable::rrb_details::validate_subtree<char,false,5>
               (ref<immutable::rrb_details::tree_node<char,_false>_> *root,uint32_t expected_size,
               uint32_t root_shift)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t *puVar3;
  ref<immutable::rrb_details::internal_node<char,_false>_> *prVar4;
  uint uVar5;
  bool bVar6;
  tree_node<char,_false> *ptVar7;
  internal_node<char,_false> *piVar8;
  rrb_size_table<false> *prVar9;
  leaf_node<char,_false> *plVar10;
  byte bVar11;
  uint32_t i_1;
  char *pcVar12;
  uint32_t i;
  ulong uVar13;
  uint32_t uVar14;
  ref<immutable::rrb_details::internal_node<char,_false>_> internal;
  ref<immutable::rrb_details::tree_node<char,_false>_> child;
  
  ptVar7 = ref<immutable::rrb_details::tree_node<char,_false>_>::operator->(root);
  if (root_shift == 0) {
    if (ptVar7->type == LEAF_NODE) {
      internal.ptr = (internal_node<char,_false> *)root->ptr;
      if (internal.ptr != (internal_node<char,_false> *)0x0) {
        (internal.ptr)->_ref_count = (internal.ptr)->_ref_count + 1;
      }
      plVar10 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                          ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&internal);
      if (plVar10->len == expected_size) {
        release<char>((leaf_node<char,_false> *)internal.ptr);
        return true;
      }
      plVar10 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                          ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&internal);
      uVar2 = plVar10->len;
      plVar10 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                          ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&internal);
      uVar5 = plVar10->len;
      if (plVar10->len <= expected_size) {
        uVar5 = expected_size;
      }
      printf("Leaf node claims to be %u elements long, but was expected to be %u\n elements long. Will attempt to read %u elements.\n"
             ,(ulong)uVar2,(ulong)expected_size,(ulong)uVar5);
      release<char>((leaf_node<char,_false> *)internal.ptr);
      return false;
    }
    puts("Expected this node to be a leaf node, but it claims to be something else.");
    pcVar12 = "Will treat it like a leaf node, so may segfault.";
LAB_00143d8c:
    puts(pcVar12);
    return false;
  }
  if (ptVar7->type != INTERNAL_NODE) {
    puts("Expected this node to be an internal node, but it claims to be something else.");
    pcVar12 = "Will treat it like an internal node, so may segfault.";
    goto LAB_00143d8c;
  }
  internal.ptr = (internal_node<char,_false> *)root->ptr;
  if (internal.ptr != (internal_node<char,_false> *)0x0) {
    (internal.ptr)->_ref_count = (internal.ptr)->_ref_count + 1;
  }
  piVar8 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal);
  if ((piVar8->size_table).ptr == (rrb_size_table<false> *)0x0) {
    bVar11 = (byte)root_shift;
    piVar8 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal);
    uVar1 = piVar8->len;
    piVar8 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal);
    if (uVar1 << (bVar11 & 0x1f) < expected_size) {
      uVar13 = (ulong)(piVar8->len << (bVar11 & 0x1f));
      pcVar12 = "Expected size (%u) is larger than what can possibly be inside this subtree: %u.\n";
    }
    else {
      if (piVar8->len - 1 << (bVar11 & 0x1f) <= expected_size) {
        uVar13 = (ulong)(uint)(0 << (bVar11 & 0x1f));
        do {
          piVar8 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal);
          if (piVar8->len - 1 <= uVar13) {
            piVar8 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal)
            ;
            prVar4 = piVar8->child;
            piVar8 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal)
            ;
            child.ptr = (tree_node<char,_false> *)prVar4[piVar8->len - 1].ptr;
            if ((internal_node<char,_false> *)child.ptr != (internal_node<char,_false> *)0x0) {
              ((internal_node<char,_false> *)child.ptr)->_ref_count =
                   ((internal_node<char,_false> *)child.ptr)->_ref_count + 1;
            }
            piVar8 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal)
            ;
            bVar6 = validate_subtree<char,false,5>
                              (&child,expected_size - (piVar8->len - 1 << (bVar11 & 0x1f)),
                               root_shift - 5);
            ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&child);
            if (bVar6) goto LAB_00143f95;
            break;
          }
          piVar8 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal);
          child.ptr = (tree_node<char,_false> *)piVar8->child[uVar13].ptr;
          if ((internal_node<char,_false> *)child.ptr != (internal_node<char,_false> *)0x0) {
            ((internal_node<char,_false> *)child.ptr)->_ref_count =
                 ((internal_node<char,_false> *)child.ptr)->_ref_count + 1;
          }
          bVar6 = validate_subtree<char,false,5>(&child,1 << (bVar11 & 0x1f),root_shift - 5);
          ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&child);
          uVar13 = uVar13 + 1;
        } while (bVar6);
        goto LAB_00143ea7;
      }
      piVar8 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal);
      uVar13 = (ulong)(piVar8->len - 1 << (bVar11 & 0x1f));
      pcVar12 = 
      "Expected size (%u) is smaller than %u, implying that some non-rightmost node\n is not completely populated.\n"
      ;
    }
  }
  else {
    piVar8 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal);
    prVar9 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->(&piVar8->size_table);
    puVar3 = prVar9->size;
    piVar8 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal);
    if (puVar3[piVar8->len - 1] == expected_size) {
      uVar13 = 0;
      do {
        piVar8 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal);
        if (piVar8->len <= uVar13) {
LAB_00143f95:
          ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&internal);
          return true;
        }
        piVar8 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal);
        prVar9 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                           (&piVar8->size_table);
        uVar1 = prVar9->size[uVar13];
        if (uVar13 == 0) {
          uVar14 = 0;
        }
        else {
          piVar8 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal);
          prVar9 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                             (&piVar8->size_table);
          uVar14 = prVar9->size[uVar13 - 1];
        }
        piVar8 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal);
        child.ptr = (tree_node<char,_false> *)piVar8->child[uVar13].ptr;
        if ((internal_node<char,_false> *)child.ptr != (internal_node<char,_false> *)0x0) {
          ((internal_node<char,_false> *)child.ptr)->_ref_count =
               ((internal_node<char,_false> *)child.ptr)->_ref_count + 1;
        }
        bVar6 = validate_subtree<char,false,5>(&child,uVar1 - uVar14,root_shift - 5);
        ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&child);
        uVar13 = uVar13 + 1;
      } while (bVar6);
      goto LAB_00143ea7;
    }
    piVar8 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal);
    prVar9 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->(&piVar8->size_table);
    puVar3 = prVar9->size;
    piVar8 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal);
    uVar13 = (ulong)puVar3[piVar8->len - 1];
    pcVar12 = "Expected subtree to be of size %u, but its size table says it is %u.\n";
  }
  printf(pcVar12,(ulong)expected_size,uVar13);
LAB_00143ea7:
  ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&internal);
  return false;
}

Assistant:

bool validate_subtree(const ref<tree_node<T, atomic_ref_counting>>& root, uint32_t expected_size, uint32_t root_shift)
      {
      if (root_shift == 0)
        { // leaf node
        if (root->type != LEAF_NODE)
          {
          printf("Expected this node to be a leaf node, but it claims to be something else.\n");
          printf("Will treat it like a leaf node, so may segfault.\n");
          return false;
          }
        ref<leaf_node<T, atomic_ref_counting>> leaf = root;
        if (leaf->len != expected_size)
          {
          printf("Leaf node claims to be %u elements long, but was expected to be %u\n elements long. Will attempt to read %u elements.\n",
            leaf->len, expected_size, std::max<uint32_t>(leaf->len, expected_size));
          return false;
          }
        }
      else
        {
        if (root->type != INTERNAL_NODE)
          {
          printf("Expected this node to be an internal node, but it claims to be something else.\n");
          printf("Will treat it like an internal node, so may segfault.\n");
          return false;
          }
        ref<internal_node<T, atomic_ref_counting>> internal = root;
        if (internal->size_table.ptr != nullptr)
          {
          // expected size should be consistent with what's in the last size table
          // slot
          if (internal->size_table->size[internal->len - 1] != expected_size)
            {
            printf("Expected subtree to be of size %u, but its size table says it is %u.\n", expected_size,
              internal->size_table->size[internal->len - 1]);
            return false;
            }
          for (uint32_t i = 0; i < internal->len; i++)
            {
            uint32_t size_sub_trie = internal->size_table->size[i] - (i == 0 ? 0 : internal->size_table->size[i - 1]);
            ref<tree_node<T, atomic_ref_counting>> child = internal->child[i];
            if (!validate_subtree<T, atomic_ref_counting, N>(child, size_sub_trie, root_shift - bits<N>::rrb_bits))
              return false;
            }
          }
        else
          {
          // internal->size_table == NULL
          // this tree may contain at most (internal->len << shift) elements, not
          // more. Effectively, the tree contains (len - 1) << shift + last_tree_len
          // (1 << shift) >= last_tree_len > 0
          const uint32_t child_shift = root_shift - bits<N>::rrb_bits;
          const uint32_t child_max_size = 1 << root_shift;

          if (expected_size > internal->len * child_max_size)
            {
            printf("Expected size (%u) is larger than what can possibly be inside this subtree: %u.\n", expected_size,
              internal->len * child_max_size);
            return false;
            }
          else if (expected_size < ((internal->len - 1) * child_max_size))
            {
            printf("Expected size (%u) is smaller than %u, implying that some non-rightmost node\n is not completely populated.\n",
              expected_size, ((internal->len - 1) << root_shift));
            return false;
            }
          for (uint32_t i = 0; i < internal->len - 1; i++)
            {
            ref<tree_node<T, atomic_ref_counting>> child = internal->child[i];
            if (!validate_subtree<T, atomic_ref_counting, N>(child, child_max_size, child_shift))
              return false;
            }
          ref<tree_node<T, atomic_ref_counting>> child = internal->child[internal->len - 1];
          if (!validate_subtree<T, atomic_ref_counting, N>(child, expected_size - ((internal->len - 1) * child_max_size), child_shift))
            return false;
          }
        }
      return true;
      }